

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::ProcessPolledData(RTPSession *this)

{
  RTCPCompoundPacket *pRVar1;
  RTPRawPacket *pRVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint32_t ssrc;
  undefined4 extraout_var;
  RTPMemoryManager *pRVar6;
  RTPAddress *addr;
  size_type sVar7;
  size_t sVar8;
  reference ppRVar9;
  uint8_t *puVar10;
  double dVar11;
  _List_iterator<jrtplib::RTCPCompoundPacket_*> local_a8;
  _List_iterator<jrtplib::RTCPCompoundPacket_*> local_a0;
  RTCPCompoundPacket *local_98;
  RTCPCompoundPacket *pack;
  bool istime;
  RTPTime notetimeout;
  RTPTime colltimeout;
  RTPTime byetimeout;
  RTPTime generaltimeout;
  RTPTime sendertimeout;
  double Td;
  RTPTime t;
  RTPTime d;
  RTCPCompoundPacket *pRStack_40;
  uint32_t newssrc;
  RTCPCompoundPacket *rtcpcomppack;
  RTPTime RStack_30;
  bool hassentpackets;
  bool local_25;
  int local_24;
  bool created;
  RTPRawPacket *pRStack_20;
  int status;
  RTPRawPacket *rawpack;
  RTPSession *this_local;
  
  rawpack = (RTPRawPacket *)this;
  do {
    while( true ) {
      iVar4 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1f])();
      pRStack_20 = (RTPRawPacket *)CONCAT44(extraout_var,iVar4);
      if (pRStack_20 == (RTPRawPacket *)0x0) {
        t = RTCPScheduler::CalculateDeterministicInterval(&this->rtcpsched,false);
        Td = (double)RTPTime::CurrentTime();
        dVar11 = RTPTime::GetDouble(&t);
        RTPTime::RTPTime(&generaltimeout,dVar11 * this->sendermultiplier);
        RTPTime::RTPTime(&byetimeout,dVar11 * this->membermultiplier);
        RTPTime::RTPTime(&colltimeout,dVar11 * this->byemultiplier);
        RTPTime::RTPTime(&notetimeout,dVar11 * this->collisionmultiplier);
        RTPTime::RTPTime((RTPTime *)&stack0xffffffffffffff78,dVar11 * this->notemultiplier);
        RTPSources::MultipleTimeouts
                  (&(this->sources).super_RTPSources,(RTPTime *)&Td,&generaltimeout,&colltimeout,
                   &byetimeout,(RTPTime *)&stack0xffffffffffffff78);
        RTPCollisionList::Timeout(&this->collisionlist,(RTPTime *)&Td,&notetimeout);
        pack._7_1_ = RTCPScheduler::IsTime(&this->rtcpsched);
        if ((bool)pack._7_1_) {
          bVar3 = std::__cxx11::
                  list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                  ::empty(&this->byepackets);
          if (bVar3) {
            local_24 = RTCPPacketBuilder::BuildNextPacket(&this->rtcpbuilder,&local_98);
            if (local_24 < 0) {
              return local_24;
            }
            puVar10 = RTCPCompoundPacket::GetCompoundPacketData(local_98);
            sVar8 = RTCPCompoundPacket::GetCompoundPacketLength(local_98);
            local_24 = SendRTCPData(this,puVar10,sVar8);
            if (local_24 < 0) {
              pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
              RTPDelete<jrtplib::RTCPCompoundPacket>(local_98,pRVar6);
              return local_24;
            }
            this->sentpackets = true;
            (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(this,local_98);
          }
          else {
            local_a0._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                 ::begin(&this->byepackets);
            ppRVar9 = std::_List_iterator<jrtplib::RTCPCompoundPacket_*>::operator*(&local_a0);
            local_98 = *ppRVar9;
            std::__cxx11::
            list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::
            pop_front(&this->byepackets);
            puVar10 = RTCPCompoundPacket::GetCompoundPacketData(local_98);
            sVar8 = RTCPCompoundPacket::GetCompoundPacketLength(local_98);
            local_24 = SendRTCPData(this,puVar10,sVar8);
            pRVar1 = local_98;
            if (local_24 < 0) {
              pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
              RTPDelete<jrtplib::RTCPCompoundPacket>(pRVar1,pRVar6);
              return local_24;
            }
            this->sentpackets = true;
            (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(this,local_98);
            bVar3 = std::__cxx11::
                    list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                    ::empty(&this->byepackets);
            if (!bVar3) {
              local_a8._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                   ::begin(&this->byepackets);
              ppRVar9 = std::_List_iterator<jrtplib::RTCPCompoundPacket_*>::operator*(&local_a8);
              sVar8 = RTCPCompoundPacket::GetCompoundPacketLength(*ppRVar9);
              RTCPScheduler::ScheduleBYEPacket(&this->rtcpsched,sVar8);
            }
          }
          RTCPScheduler::AnalyseOutgoing(&this->rtcpsched,local_98);
          pRVar1 = local_98;
          pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPDelete<jrtplib::RTCPCompoundPacket>(pRVar1,pRVar6);
        }
        return 0;
      }
      if (((this->m_changeIncomingData & 1U) == 0) ||
         (uVar5 = (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x17])(this,pRStack_20),
         pRVar2 = pRStack_20, (uVar5 & 1) != 0)) break;
      pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTPRawPacket>(pRVar2,pRVar6);
    }
    RTPSessionSources::ClearOwnCollisionFlag(&this->sources);
    local_24 = RTPSources::ProcessRawPacket
                         (&(this->sources).super_RTPSources,pRStack_20,this->rtptrans,
                          (bool)(this->acceptownpackets & 1));
    pRVar2 = pRStack_20;
    if (local_24 < 0) {
      pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTPRawPacket>(pRVar2,pRVar6);
      return local_24;
    }
    bVar3 = RTPSessionSources::DetectedOwnCollision(&this->sources);
    if (bVar3) {
      addr = RTPRawPacket::GetSenderAddress(pRStack_20);
      RStack_30 = RTPRawPacket::GetReceiveTime(pRStack_20);
      local_24 = RTPCollisionList::UpdateAddress
                           (&this->collisionlist,addr,&stack0xffffffffffffffd0,&local_25);
      pRVar2 = pRStack_20;
      if (local_24 < 0) {
        pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        RTPDelete<jrtplib::RTPRawPacket>(pRVar2,pRVar6);
        return local_24;
      }
      if ((local_25 & 1U) != 0) {
        rtcpcomppack._7_1_ = this->sentpackets & 1;
        if (rtcpcomppack._7_1_ != 0) {
          local_24 = RTCPPacketBuilder::BuildBYEPacket
                               (&this->rtcpbuilder,&stack0xffffffffffffffc0,(void *)0x0,0,
                                (bool)(this->useSR_BYEifpossible & 1));
          pRVar2 = pRStack_20;
          if (local_24 < 0) {
            pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
            RTPDelete<jrtplib::RTPRawPacket>(pRVar2,pRVar6);
            return local_24;
          }
          std::__cxx11::
          list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::
          push_back(&this->byepackets,&stack0xffffffffffffffc0);
          sVar7 = std::__cxx11::
                  list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                  ::size(&this->byepackets);
          if (sVar7 == 1) {
            sVar8 = RTCPCompoundPacket::GetCompoundPacketLength(pRStack_40);
            RTCPScheduler::ScheduleBYEPacket(&this->rtcpsched,sVar8);
          }
        }
        ssrc = RTPPacketBuilder::CreateNewSSRC
                         (&this->packetbuilder,&(this->sources).super_RTPSources);
        this->sentpackets = false;
        local_24 = RTPSources::DeleteOwnSSRC(&(this->sources).super_RTPSources);
        pRVar2 = pRStack_20;
        if (local_24 < 0) {
          pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPDelete<jrtplib::RTPRawPacket>(pRVar2,pRVar6);
          return local_24;
        }
        local_24 = RTPSources::CreateOwnSSRC(&(this->sources).super_RTPSources,ssrc);
        pRVar2 = pRStack_20;
        if (local_24 < 0) {
          pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPDelete<jrtplib::RTPRawPacket>(pRVar2,pRVar6);
          return local_24;
        }
      }
    }
    pRVar2 = pRStack_20;
    pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPRawPacket>(pRVar2,pRVar6);
  } while( true );
}

Assistant:

int RTPSession::ProcessPolledData()
{
	RTPRawPacket *rawpack;
	int status;
	
	SOURCES_LOCK
	while ((rawpack = rtptrans->GetNextPacket()) != 0)
	{
		if (m_changeIncomingData)
		{
			// Provide a way to change incoming data, for decryption for example
			if (!OnChangeIncomingData(rawpack))
			{
				RTPDelete(rawpack,GetMemoryManager());
				continue;
			}
		}

		sources.ClearOwnCollisionFlag();

		// since our sources instance also uses the scheduler (analysis of incoming packets)
		// we'll lock it
		SCHED_LOCK
		if ((status = sources.ProcessRawPacket(rawpack,rtptrans,acceptownpackets)) < 0)
		{
			SCHED_UNLOCK
			SOURCES_UNLOCK
			RTPDelete(rawpack,GetMemoryManager());
			return status;
		}
		SCHED_UNLOCK
				
		if (sources.DetectedOwnCollision()) // collision handling!
		{
			bool created;
			
			if ((status = collisionlist.UpdateAddress(rawpack->GetSenderAddress(),rawpack->GetReceiveTime(),&created)) < 0)
			{
				SOURCES_UNLOCK
				RTPDelete(rawpack,GetMemoryManager());
				return status;
			}

			if (created) // first time we've encountered this address, send bye packet and
			{            // change our own SSRC
				PACKSENT_LOCK
				bool hassentpackets = sentpackets;
				PACKSENT_UNLOCK

				if (hassentpackets)
				{
					// Only send BYE packet if we've actually sent data using this
					// SSRC
					
					RTCPCompoundPacket *rtcpcomppack;

					BUILDER_LOCK
					if ((status = rtcpbuilder.BuildBYEPacket(&rtcpcomppack,0,0,useSR_BYEifpossible)) < 0)
					{
						BUILDER_UNLOCK
						SOURCES_UNLOCK
						RTPDelete(rawpack,GetMemoryManager());
						return status;
					}
					BUILDER_UNLOCK

					byepackets.push_back(rtcpcomppack);
					if (byepackets.size() == 1) // was the first packet, schedule a BYE packet (otherwise there's already one scheduled)
					{
						SCHED_LOCK
						rtcpsched.ScheduleBYEPacket(rtcpcomppack->GetCompoundPacketLength());
						SCHED_UNLOCK
					}
				}
				// bye packet is built and scheduled, now change our SSRC
				// and reset the packet count in the transmitter
				
				BUILDER_LOCK
				uint32_t newssrc = packetbuilder.CreateNewSSRC(sources);
				BUILDER_UNLOCK
					
				PACKSENT_LOCK
				sentpackets = false;
				PACKSENT_UNLOCK
	
				// remove old entry in source table and add new one

				if ((status = sources.DeleteOwnSSRC()) < 0)
				{
					SOURCES_UNLOCK
					RTPDelete(rawpack,GetMemoryManager());
					return status;
				}
				if ((status = sources.CreateOwnSSRC(newssrc)) < 0)
				{
					SOURCES_UNLOCK
					RTPDelete(rawpack,GetMemoryManager());
					return status;
				}
			}
		}
		RTPDelete(rawpack,GetMemoryManager());
	}

	SCHED_LOCK
	RTPTime d = rtcpsched.CalculateDeterministicInterval(false);
	SCHED_UNLOCK
	
	RTPTime t = RTPTime::CurrentTime();
	double Td = d.GetDouble();
	RTPTime sendertimeout = RTPTime(Td*sendermultiplier);
	RTPTime generaltimeout = RTPTime(Td*membermultiplier);
	RTPTime byetimeout = RTPTime(Td*byemultiplier);
	RTPTime colltimeout = RTPTime(Td*collisionmultiplier);
	RTPTime notetimeout = RTPTime(Td*notemultiplier);
	
	sources.MultipleTimeouts(t,sendertimeout,byetimeout,generaltimeout,notetimeout);
	collisionlist.Timeout(t,colltimeout);
	
	// We'll check if it's time for RTCP stuff

	SCHED_LOCK
	bool istime = rtcpsched.IsTime();
	SCHED_UNLOCK
	
	if (istime)
	{
		RTCPCompoundPacket *pack;
	
		// we'll check if there's a bye packet to send, or just a normal packet

		if (byepackets.empty())
		{
			BUILDER_LOCK
			if ((status = rtcpbuilder.BuildNextPacket(&pack)) < 0)
			{
				BUILDER_UNLOCK
				SOURCES_UNLOCK
				return status;
			}
			BUILDER_UNLOCK
			if ((status = SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength())) < 0)
			{
				SOURCES_UNLOCK
				RTPDelete(pack,GetMemoryManager());
				return status;
			}
		
			PACKSENT_LOCK
			sentpackets = true;
			PACKSENT_UNLOCK

			OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
		}
		else
		{
			pack = *(byepackets.begin());
			byepackets.pop_front();
			
			if ((status = SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength())) < 0)
			{
				SOURCES_UNLOCK
				RTPDelete(pack,GetMemoryManager());
				return status;
			}
			
			PACKSENT_LOCK
			sentpackets = true;
			PACKSENT_UNLOCK

			OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
			
			if (!byepackets.empty()) // more bye packets to send, schedule them
			{
				SCHED_LOCK
				rtcpsched.ScheduleBYEPacket((*(byepackets.begin()))->GetCompoundPacketLength());
				SCHED_UNLOCK
			}
		}
		
		SCHED_LOCK
		rtcpsched.AnalyseOutgoing(*pack);
		SCHED_UNLOCK

		RTPDelete(pack,GetMemoryManager());
	}
	SOURCES_UNLOCK
	return 0;
}